

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O2

int __thiscall QtMWidgets::PageView::indexOf(PageView *this,QWidget *widget)

{
  PageViewPrivate *pPVar1;
  int i;
  long lVar2;
  
  pPVar1 = (this->d).d;
  lVar2 = 0;
  while( true ) {
    if ((pPVar1->pages).d.size <= lVar2) {
      return -1;
    }
    if ((pPVar1->pages).d.ptr[lVar2] == widget) break;
    lVar2 = lVar2 + 1;
  }
  return (int)lVar2;
}

Assistant:

int
PageView::indexOf( QWidget * widget ) const
{
	for( int i = 0; i < d->pages.count(); ++i )
	{
		if( d->pages.at( i ) == widget )
			return i;
	}

	return -1;
}